

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O0

int __thiscall Variation::getLengthDifference(Variation *this)

{
  code *pcVar1;
  Variation *this_local;
  int local_4;
  
  if (*(int *)(this + 0x60) == 1) {
    local_4 = -(int)*(undefined8 *)(this + 0x30);
  }
  else {
    if (*(int *)(this + 0x60) != 2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_4 = (int)*(undefined8 *)(this + 0x30) - (int)*(undefined8 *)(this + 0x28);
  }
  return local_4;
}

Assistant:

int Variation::getLengthDifference() const {
	switch (type) {
	case Variation::INSERTION:
		return -(int)coord2;
	case Variation::DELETION:
		return ((int)coord2) - ((int)coord1);
	default:
		assert(false);
	}
}